

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerResults.cpp
# Opt level: O3

void __thiscall
EnrichableI2cAnalyzerResults::GenerateFrameTabularText
          (EnrichableI2cAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  ostream *poVar1;
  AddressDisplay AVar2;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar3;
  U64 packetId;
  size_t sVar4;
  uint uVar5;
  ulonglong uVar6;
  string *tabularText;
  pointer pbVar7;
  Frame frame;
  char ack [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tabularLines;
  char number_str [128];
  char *local_2a0;
  char local_290 [16];
  Frame local_280 [16];
  byte local_270;
  undefined7 uStack_26f;
  char local_260;
  byte local_25f;
  undefined8 local_258;
  char acStack_250 [32];
  undefined1 local_230 [128];
  ios_base local_1b0 [264];
  char local_a8 [136];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_280);
  bVar3 = EnrichableAnalyzerSubprocess::TabularEnabled(this->mSubprocess);
  if (bVar3) {
    this_00 = this->mSubprocess;
    packetId = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    EnrichableAnalyzerSubprocess::EmitTabular_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_230,this_00,packetId,frame_index,local_280);
    for (pbVar7 = (pointer)local_230._0_8_; pbVar7 != (pointer)local_230._8_8_; pbVar7 = pbVar7 + 1)
    {
      AnalyzerResults::AddTabularText
                ((char *)this,(pbVar7->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_230);
    goto LAB_0010a0da;
  }
  if ((local_25f & 1) == 0) {
    if ((local_25f & 2) == 0) {
      local_258._0_4_ = 0x4b414e;
    }
    else {
      local_258._0_1_ = 'M';
      local_258._1_1_ = 'i';
      local_258._2_1_ = 's';
      local_258._3_1_ = 's';
      local_258._4_1_ = 'i';
      local_258._5_1_ = 'n';
      local_258._6_1_ = 'g';
      local_258._7_1_ = ' ';
      builtin_strncpy(acStack_250,"ACK/NAK",8);
    }
  }
  else {
    local_258._0_4_ = 0x4b4341;
  }
  if (local_260 == '\0') {
    AVar2 = this->mSettings->mAddressDisplay;
    if (AVar2 == YES_DIRECTION_8) {
      uVar5 = 8;
      uVar6 = CONCAT71(uStack_26f,local_270);
LAB_00109f3c:
      AnalyzerHelpers::GetNumberString(uVar6,display_base,uVar5,local_a8,0x80);
    }
    else {
      if (AVar2 == NO_DIRECTION_8) {
        uVar6 = (ulonglong)((uint)CONCAT71(uStack_26f,local_270) & 0xfe);
        uVar5 = 8;
        goto LAB_00109f3c;
      }
      if (AVar2 == NO_DIRECTION_7) {
        uVar6 = CONCAT71(uStack_26f,local_270) >> 1;
        uVar5 = 7;
        goto LAB_00109f3c;
      }
    }
    if ((local_270 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_230);
      poVar1 = (ostream *)(local_230 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Setup Write to [",0x10);
      sVar4 = strlen(local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_a8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_2a0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_230);
      poVar1 = (ostream *)(local_230 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Setup Read to [",0xf);
      sVar4 = strlen(local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_a8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_2a0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_26f,local_270),display_base,8,local_a8,0x80);
    std::__cxx11::stringstream::stringstream((stringstream *)local_230);
    poVar1 = (ostream *)(local_230 + 0x10);
    sVar4 = strlen(local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_a8,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
    sVar4 = strlen((char *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_258,sVar4);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_2a0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
  std::ios_base::~ios_base(local_1b0);
LAB_0010a0da:
  Frame::~Frame(local_280);
  return;
}

Assistant:

void EnrichableI2cAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

	Frame frame = GetFrame( frame_index );

	if(mSubprocess->TabularEnabled()) {
		std::vector<std::string> tabularLines = mSubprocess->EmitTabular(
			GetPacketContainingFrameSequential( frame_index ),
			frame_index,
			frame
		);
		for(const std::string& tabularText: tabularLines) {
			AddTabularText(tabularText.c_str());
		}
	} else {
		char ack[32];
		if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof(ack), "ACK" );
		else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
		else
			snprintf( ack, sizeof(ack), "NAK" );

		if( frame.mType == I2cAddress )
		{
			char number_str[128];
			switch( mSettings->mAddressDisplay )
			{
			case NO_DIRECTION_7:
				AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );
				break;
			case NO_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1 & 0xFE, display_base, 8, number_str, 128 );
				break;
			case YES_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
				break;
			}

			I2cDirection direction;
			if( ( frame.mData1 & 0x1 ) != 0 )
				direction = I2C_READ;
			else
				direction = I2C_WRITE;

			if( direction == I2C_READ )
			{
				std::stringstream ss;
				ss << "Setup Read to [" << number_str << "] + " << ack;
				AddTabularText( ss.str().c_str() );
			}else
			{
				std::stringstream ss;
				ss << "Setup Write to [" << number_str << "] + " << ack;
				AddTabularText( ss.str().c_str() );
			}
		}else
		{
			char number_str[128];
			AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
			std::stringstream ss;
			ss << number_str << " + " << ack;
			AddTabularText( ss.str().c_str() );
		}
	}
}